

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# electron_optimisation.cpp
# Opt level: O0

void __thiscall indigox::ElectronOpt::DeterminePotentialElectronLocations(ElectronOpt *this)

{
  EdgeType e_00;
  EdgeType e_01;
  MolVertPair id_00;
  bool bVar1;
  type_conflict tVar2;
  ElnVertProp *pEVar3;
  ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *poVar4;
  size_t sVar5;
  element_type *peVar6;
  MolVertPair id_1;
  uint8_t order;
  int8_t v_miss;
  int8_t u_miss;
  int8_t v_bond;
  int8_t u_bond;
  int8_t v_oct;
  int8_t u_oct;
  MolVertex tmp;
  MolVertex v_1;
  MolVertex u;
  MolEdgeIter e;
  MolEdgeIterPair es;
  ElnVertex ev;
  MolVertPair id;
  int8_t missingElectrons;
  int8_t bondedElectrons;
  int8_t octet;
  MolVertexIter v;
  MolVertIterPair vs;
  Atom *in_stack_fffffffffffffdf8;
  data_with_functor_bag<_6f47b1ab_> this_00;
  data_with_functor_bag<_88242e54_> in_stack_fffffffffffffe00;
  header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  this_01;
  value_type *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  ElectronGraph *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  uint8_t in_stack_fffffffffffffe27;
  void *in_stack_fffffffffffffe28;
  byte local_131;
  undefined1 local_130 [104];
  ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *local_c8;
  header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>_>_*,_boost::multi_index::multi_index_container<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
  local_b8;
  ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *local_a8;
  iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
  local_a0;
  EdgeIterPair local_98;
  void *local_88;
  void *local_80;
  ElnVertex local_78;
  pair<void_*,_void_*> local_70;
  char local_5a;
  char local_59;
  uint8_t local_21;
  _Self local_20;
  VertIterPair local_18;
  
  std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x12ee28);
  local_18 = utils::
             Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
             GetVertices((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                          *)0x12ee30);
  local_20._M_node = local_18.first._M_node;
  while (bVar1 = std::operator!=(&local_20,&local_18.second), bVar1) {
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12ee83);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffe00.data)
    ;
    sVar5 = utils::
            Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
            Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    *)in_stack_fffffffffffffe00.data,in_stack_fffffffffffffdf8);
    if (sVar5 < 3) {
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12ef7d);
      std::_List_iterator<void_*>::operator*
                ((_List_iterator<void_*> *)in_stack_fffffffffffffe00.data);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffe00.data,in_stack_fffffffffffffdf8);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12efaa);
      Atom::GetElement(in_stack_fffffffffffffdf8);
      peVar6 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12efcf);
      local_21 = Element::GetOctet(peVar6);
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12effb);
    }
    else {
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12eec3);
      std::_List_iterator<void_*>::operator*
                ((_List_iterator<void_*> *)in_stack_fffffffffffffe00.data);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffe00.data,in_stack_fffffffffffffdf8);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12eef0);
      Atom::GetElement(in_stack_fffffffffffffdf8);
      peVar6 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12ef15);
      local_21 = Element::GetHypervalentOctet(peVar6);
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12ef41);
    }
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f034);
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffe00.data)
    ;
    sVar5 = utils::
            Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
            Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    *)in_stack_fffffffffffffe00.data,in_stack_fffffffffffffdf8);
    local_59 = (char)(sVar5 << 1);
    local_5a = local_21 - local_59;
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffe00.data)
    ;
    std::_List_iterator<void_*>::operator*((_List_iterator<void_*> *)in_stack_fffffffffffffe00.data)
    ;
    local_70 = std::make_pair<void*&,void*&>
                         ((void **)in_stack_fffffffffffffe00.data,(void **)in_stack_fffffffffffffdf8
                         );
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f0c3);
    local_88 = local_70.first;
    local_80 = local_70.second;
    id_00.first._7_1_ = in_stack_fffffffffffffe27;
    id_00.first._0_7_ = in_stack_fffffffffffffe20;
    id_00.second = in_stack_fffffffffffffe28;
    local_78 = ElectronGraph::GetVertex(in_stack_fffffffffffffe18,id_00);
    std::__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::ElectronGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f114);
    pEVar3 = utils::
             Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
             ::GetProperties((Graph<indigox::ElnVertProp,_indigox::utils::NoProperty,_indigox::utils::UndirectedGraph>
                              *)in_stack_fffffffffffffe00.data,in_stack_fffffffffffffdf8);
    local_5a = local_5a - pEVar3->pre_placed;
    while ('\0' < local_5a) {
      std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::push_back
                ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
                 CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08);
      if ((Options::AssignElectrons::USE_ELECTRON_PAIRS & 1U) == 0) {
        local_5a = local_5a + -1;
      }
      else {
        local_5a = local_5a + -2;
      }
    }
    std::_List_iterator<void_*>::operator++(&local_20);
  }
  std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x12f1b8);
  local_98 = utils::
             Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
             GetEdges((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                       *)0x12f1c0);
  local_a0.m_iterator._M_node =
       (_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>)
       (_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>)
       local_98.first.
       super_iterator_adaptor<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::use_default,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
       .m_iterator._M_node;
  while (tVar2 = boost::iterators::operator!=
                           ((iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                             *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                            (iterator_facade<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>
                             *)in_stack_fffffffffffffe08), tVar2) {
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f213);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator*((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                 *)in_stack_fffffffffffffe00.data);
    e_00.super_edge_base<boost::undirected_tag,_void_*>.m_source._7_1_ = in_stack_fffffffffffffe17;
    e_00.super_edge_base<boost::undirected_tag,_void_*>.m_source._0_7_ = in_stack_fffffffffffffe10;
    e_00.super_edge_base<boost::undirected_tag,_void_*>.m_target = in_stack_fffffffffffffe18;
    e_00.m_eproperty._0_7_ = in_stack_fffffffffffffe20;
    e_00.m_eproperty._7_1_ = in_stack_fffffffffffffe27;
    this_01.member = local_b8.member;
    local_a8 = (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                *)utils::
                  Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                  ::GetSource((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                               *)local_b8.member,e_00);
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f271);
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator*((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                 *)this_01.member);
    e_01.super_edge_base<boost::undirected_tag,_void_*>.m_source._7_1_ = in_stack_fffffffffffffe17;
    e_01.super_edge_base<boost::undirected_tag,_void_*>.m_source._0_7_ = in_stack_fffffffffffffe10;
    e_01.super_edge_base<boost::undirected_tag,_void_*>.m_target = in_stack_fffffffffffffe18;
    e_01.m_eproperty._0_7_ = in_stack_fffffffffffffe20;
    e_01.m_eproperty._7_1_ = in_stack_fffffffffffffe27;
    this_00.data = (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_void_*,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<void_*>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                    *)local_130._80_8_;
    in_stack_fffffffffffffe00.data =
         (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_long,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::right>,_std::less<unsigned_long>,_boost::multi_index::detail::nth_layer<1,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<void_*,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<void_*const,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::right,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          *)local_130._88_8_;
    in_stack_fffffffffffffe08 = (value_type *)local_130._96_8_;
    poVar4 = (ordered_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>_>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_unsigned_long,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_unsigned_long,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
              *)utils::
                Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
                GetTarget((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                           *)local_130._88_8_,e_01);
    local_c8 = poVar4;
    if (poVar4 < local_a8) {
      local_130._72_8_ = local_a8;
      local_c8 = local_a8;
      local_a8 = poVar4;
    }
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f311);
    sVar5 = utils::
            Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
            Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    *)in_stack_fffffffffffffe00.data,this_00.data);
    if (sVar5 < 3) {
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12f3d5);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffe00.data,this_00.data);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12f3ed);
      Atom::GetElement((Atom *)this_00.data);
      peVar6 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12f40c);
      local_130[0x47] = Element::GetOctet(peVar6);
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12f432);
    }
    else {
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12f33c);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffe00.data,this_00.data);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12f354);
      Atom::GetElement((Atom *)this_00.data);
      peVar6 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12f373);
      local_130[0x47] = Element::GetHypervalentOctet(peVar6);
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12f399);
    }
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f46b);
    sVar5 = utils::
            Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
            Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    *)in_stack_fffffffffffffe00.data,this_00.data);
    if (sVar5 < 3) {
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12f52f);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffe00.data,this_00.data);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12f547);
      in_stack_fffffffffffffe18 = (ElectronGraph *)local_130;
      Atom::GetElement((Atom *)this_00.data);
      peVar6 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12f566);
      in_stack_fffffffffffffe27 = Element::GetOctet(peVar6);
      local_130[0x46] = in_stack_fffffffffffffe27;
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12f58c);
    }
    else {
      std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x12f496);
      utils::Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
      GetProperties((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                     *)in_stack_fffffffffffffe00.data,this_00.data);
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12f4ae);
      Atom::GetElement((Atom *)this_00.data);
      peVar6 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x12f4cd);
      local_130[0x46] = Element::GetHypervalentOctet(peVar6);
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x12f4f3);
    }
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f5c5);
    sVar5 = utils::
            Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
            Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    *)in_stack_fffffffffffffe00.data,this_00.data);
    local_130[0x45] = (char)(sVar5 << 1);
    std::__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x12f5f0);
    sVar5 = utils::
            Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>::
            Degree((Graph<indigox::MolVertProp,_indigox::MolEdgeProp,_indigox::utils::UndirectedGraph>
                    *)in_stack_fffffffffffffe00.data,this_00.data);
    local_130[0x44] = (char)(sVar5 << 1);
    local_130[0x43] = local_130[0x47] - local_130[0x45];
    local_130[0x42] = local_130[0x46] - local_130[0x44];
    local_131 = 1;
    std::make_pair<void*&,void*&>((void **)in_stack_fffffffffffffe00.data,(void **)this_00.data);
    while( true ) {
      in_stack_fffffffffffffe17 = false;
      if (('\0' < local_130[0x43]) && (in_stack_fffffffffffffe17 = false, '\0' < local_130[0x42])) {
        in_stack_fffffffffffffe17 = local_131 <= Options::AssignElectrons::MAXIMUM_BOND_ORDER;
      }
      if ((bool)in_stack_fffffffffffffe17 == false) break;
      std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::push_back
                ((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
                 CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08);
      if ((Options::AssignElectrons::USE_ELECTRON_PAIRS & 1U) == 0) {
        std::vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_>::
        push_back((vector<std::pair<void_*,_void_*>,_std::allocator<std::pair<void_*,_void_*>_>_> *)
                  CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                  in_stack_fffffffffffffe08);
      }
      local_130[0x43] = local_130[0x43] + -2;
      local_130[0x42] = local_130[0x42] + -2;
      local_131 = local_131 + 1;
    }
    boost::iterators::detail::
    iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::detail::undirected_edge_iter<std::_List_iterator<boost::list_edge<void_*,_indigox::MolEdgeProp>_>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long>,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_boost::iterators::bidirectional_traversal_tag,_boost::detail::edge_desc_impl<boost::undirected_tag,_void_*>,_long,_false,_false>
                  *)in_stack_fffffffffffffe00.data);
  }
  return;
}

Assistant:

void ElectronOpt::DeterminePotentialElectronLocations() {
  MolVertIterPair vs = molGraph_->GetVertices();
  for (MolVertexIter v = vs.first; v != vs.second; ++v) {
    int8_t octet;
    if (molGraph_->Degree(*v) > 2)
      octet = molGraph_->GetProperties(*v)->atom->GetElement()->GetHypervalentOctet();
    else
      octet = molGraph_->GetProperties(*v)->atom->GetElement()->GetOctet();
    
    int8_t bondedElectrons = 2 * molGraph_->Degree(*v);
    int8_t missingElectrons = octet - bondedElectrons;
    
    MolVertPair id = std::make_pair(*v, *v);
    // Preplace code
    ElnVertex ev = elnGraph_->GetVertex(id);
    missingElectrons -= elnGraph_->GetProperties(ev)->pre_placed;
    // End Preplace code
    
    while (missingElectrons > 0) {
      possibleLocations_.push_back(id);
      if (opt_::USE_ELECTRON_PAIRS)
        missingElectrons -= 2;
      else
        missingElectrons -= 1;
    }
  }
  
  MolEdgeIterPair es = molGraph_->GetEdges();
  for (MolEdgeIter e = es.first; e != es.second; ++e) {
    MolVertex u = molGraph_->GetSource(*e);
    MolVertex v = molGraph_->GetTarget(*e);
    if (u > v) {
      MolVertex tmp = u;
      u = v;
      v = tmp;
    }
    int8_t u_oct, v_oct, u_bond, v_bond, u_miss, v_miss;
    if (molGraph_->Degree(u) > 2)
      u_oct = molGraph_->GetProperties(u)->atom->GetElement()->GetHypervalentOctet();
    else
      u_oct = molGraph_->GetProperties(u)->atom->GetElement()->GetOctet();
    if (molGraph_->Degree(v) > 2)
      v_oct = molGraph_->GetProperties(v)->atom->GetElement()->GetHypervalentOctet();
    else
      v_oct = molGraph_->GetProperties(v)->atom->GetElement()->GetOctet();
    u_bond = 2 * molGraph_->Degree(u);
    v_bond = 2 * molGraph_->Degree(v);
    u_miss = u_oct - u_bond;
    v_miss = v_oct - v_bond;
    uint8_t order = 1;
    MolVertPair id = std::make_pair(u, v);
    // TODO: Check energy tables for available bond orders
    while (u_miss > 0 && v_miss > 0 && order <= opt_::MAXIMUM_BOND_ORDER) {
      possibleLocations_.push_back(id);
      if (!opt_::USE_ELECTRON_PAIRS)
        possibleLocations_.push_back(id);
      u_miss -= 2;
      v_miss -= 2;
      order++;
    }
  }
}